

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

bool __thiscall slang::ast::Type::isBooleanConvertible(Type *this)

{
  bool bVar1;
  Type *pTVar2;
  SymbolKind SVar3;
  
  if (this->canonical == (Type *)0x0) {
    this->canonical = this;
    pTVar2 = this;
    do {
      pTVar2 = DeclaredType::getType((DeclaredType *)(pTVar2 + 1));
      this->canonical = pTVar2;
      SVar3 = (pTVar2->super_Symbol).kind;
    } while (SVar3 == TypeAlias);
  }
  else {
    SVar3 = (this->canonical->super_Symbol).kind;
  }
  if ((0xc < SVar3 - ClassType) || ((0x107bU >> (SVar3 - ClassType & 0x1f) & 1) == 0)) {
    bVar1 = isIntegral(this);
    if (!bVar1) {
      bVar1 = isFloating(this);
      return bVar1;
    }
  }
  return true;
}

Assistant:

bool Type::isBooleanConvertible() const {
    switch (getCanonicalType().kind) {
        case SymbolKind::NullType:
        case SymbolKind::CHandleType:
        case SymbolKind::StringType:
        case SymbolKind::EventType:
        case SymbolKind::ClassType:
        case SymbolKind::CovergroupType:
        case SymbolKind::VirtualInterfaceType:
            return true;
        default:
            return isNumeric();
    }
}